

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.hpp
# Opt level: O0

LONG CorUnix::CPalSynchronizationManager::ResetLocalSynchLock(CPalThread *pthrCurrent)

{
  int iVar1;
  LONG lRet;
  CPalThread *pthrCurrent_local;
  
  iVar1 = ::Volatile::operator_cast_to_int
                    ((Volatile *)&(pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount);
  if (iVar1 < 0) {
    fprintf(_stderr,"] %s %s:%d","ResetLocalSynchLock",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.hpp"
            ,0x285);
    fprintf(_stderr,"Expression: 0 <= lRet\n");
  }
  if (0 < iVar1) {
    Volatile<int>::operator=(&(pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount,0);
    InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csSynchProcessLock);
    CThreadSynchronizationInfo::RunDeferredThreadConditionSignalings
              (&pthrCurrent->synchronizationInfo);
  }
  return iVar1;
}

Assistant:

static LONG ResetLocalSynchLock(CPalThread * pthrCurrent) 
        {
            LONG lRet = pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount;

            _ASSERTE(0 <= lRet);
            if (0 < lRet)
            {
                pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount = 0;
                InternalLeaveCriticalSection(pthrCurrent, &s_csSynchProcessLock);

#if SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING && !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
                pthrCurrent->synchronizationInfo.RunDeferredThreadConditionSignalings();
#endif // SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING && !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
            }            
            return lRet;
        }